

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O1

void __thiscall ipx::Iterate::ResidualsFromDropping(Iterate *this,double *pres,double *dres)

{
  StateDetail SVar1;
  int iVar2;
  int iVar3;
  Model *pMVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  pointer piVar10;
  uint uVar11;
  double *pdVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  pMVar4 = this->model_;
  uVar11 = pMVar4->num_cols_ + pMVar4->num_rows_;
  if (uVar11 == 0 || SCARRY4(pMVar4->num_cols_,pMVar4->num_rows_) != (int)uVar11 < 0) {
    dVar16 = 0.0;
    dVar15 = 0.0;
  }
  else {
    pdVar5 = (this->zl_)._M_data;
    pdVar6 = (this->x_)._M_data;
    pdVar7 = (this->xl_)._M_data;
    pdVar8 = (this->zu_)._M_data;
    pdVar9 = (this->xu_)._M_data;
    piVar10 = (pMVar4->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar15 = 0.0;
    uVar14 = 0;
    dVar16 = 0.0;
    do {
      SVar1 = (this->variable_state_).
              super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar14];
      if (SVar1 == BARRIER_BOXED) {
        dVar17 = pdVar5[uVar14];
        dVar19 = pdVar7[uVar14];
        dVar18 = pdVar8[uVar14];
        dVar20 = pdVar9[uVar14];
        auVar21._8_8_ = dVar18;
        auVar21._0_8_ = dVar17;
        auVar22._8_8_ = dVar20;
        auVar22._0_8_ = dVar19;
        auVar22 = divpd(auVar21,auVar22);
        if (auVar22._8_8_ <= auVar22._0_8_) {
          if (dVar19 <= dVar17) {
LAB_003a4dfd:
            dVar18 = pdVar6[uVar14];
            pdVar12 = (pMVar4->lb_)._M_data;
            goto LAB_003a4e0a;
          }
        }
        else if (dVar20 <= dVar18) goto LAB_003a4dde;
LAB_003a4df3:
        dVar17 = dVar17 - dVar18;
        dVar18 = 0.0;
      }
      else if (SVar1 == BARRIER_UB) {
        dVar18 = pdVar8[uVar14];
        if (dVar18 < pdVar9[uVar14]) {
          dVar17 = pdVar5[uVar14];
          goto LAB_003a4df3;
        }
LAB_003a4dde:
        dVar18 = pdVar6[uVar14];
        pdVar12 = (pMVar4->ub_)._M_data;
LAB_003a4e0a:
        dVar18 = dVar18 - pdVar12[uVar14];
        dVar17 = 0.0;
      }
      else {
        dVar18 = 0.0;
        dVar17 = 0.0;
        if (SVar1 == BARRIER_LB) {
          if (pdVar7[uVar14] <= pdVar5[uVar14]) goto LAB_003a4dfd;
          dVar17 = pdVar5[uVar14] - pdVar8[uVar14];
        }
      }
      iVar2 = piVar10[uVar14];
      lVar13 = (long)iVar2;
      iVar3 = piVar10[uVar14 + 1];
      dVar19 = 0.0;
      if (iVar2 < iVar3) {
        dVar20 = 0.0;
        do {
          dVar19 = ABS((pMVar4->AI_).values_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar13]);
          if (dVar19 <= dVar20) {
            dVar19 = dVar20;
          }
          lVar13 = lVar13 + 1;
          dVar20 = dVar19;
        } while (iVar3 != lVar13);
      }
      uVar14 = uVar14 + 1;
      dVar20 = ABS(dVar18) * dVar19;
      if (ABS(dVar18) * dVar19 <= dVar15) {
        dVar20 = dVar15;
      }
      dVar15 = dVar20;
      dVar18 = ABS(dVar17);
      if (ABS(dVar17) <= dVar16) {
        dVar18 = dVar16;
      }
      dVar16 = dVar18;
    } while (uVar14 != uVar11);
  }
  if (pres != (double *)0x0) {
    *pres = dVar15;
  }
  if (dres != (double *)0x0) {
    *dres = dVar16;
  }
  return;
}

Assistant:

void Iterate::ResidualsFromDropping(double* pres, double* dres) const {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const SparseMatrix& AI = model_.AI();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    double presmax = 0.0;
    double dresmax = 0.0;

    for (Int j = 0; j < n+m; j++) {
        double xdrop = 0.0;     // xnew = xold - xdrop
        double zdrop = 0.0;
        switch (variable_state_[j]) {
        case StateDetail::BARRIER_LB:
            if (zl_[j] >= xl_[j])
                xdrop = x_[j]-lb[j];   // active at lower bound
            else
                zdrop = zl_[j]-zu_[j]; // inactive
            break;
        case StateDetail::BARRIER_UB:
            if (zu_[j] >= xu_[j])
                xdrop = x_[j]-ub[j];   // active at upper bound
            else
                zdrop = zl_[j]-zu_[j]; // inactive
            break;
        case StateDetail::BARRIER_BOXED:
            if (zl_[j]/xl_[j] >= zu_[j]/xu_[j]) {
                if (zl_[j] >= xl_[j])
                    xdrop = x_[j]-lb[j];   // active at lower bound
                else
                    zdrop = zl_[j]-zu_[j]; // inactive
            } else {
                if (zu_[j] >= xu_[j])
                    xdrop = x_[j]-ub[j];   // active at upper bound
                else
                    zdrop = zl_[j]-zu_[j]; // inactive
            }
            break;
        default: ;
        }
        double amax = 0.0;
        for (Int p = AI.begin(j); p < AI.begin(j+1); p++)
            amax = std::max(amax, std::abs(AI.value(p)));
        presmax = std::max(presmax, std::abs(xdrop) * amax);
        dresmax = std::max(dresmax, std::abs(zdrop));
    }
    if (pres)
        *pres = presmax;
    if (dres)
        *dres = dresmax;
}